

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  Index IVar1;
  Index IVar2;
  Index num_params;
  Index index_local;
  Func *this_local;
  
  IVar1 = FuncDeclaration::GetNumParams(&this->decl);
  if (index < IVar1) {
    this_local = (Func *)GetParamType(this,index);
  }
  else {
    IVar2 = LocalTypes::size(&this->local_types);
    if (IVar2 <= index - IVar1) {
      __assert_fail("index < local_types.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/ir.cc"
                    ,0xd9,"Type wabt::Func::GetLocalType(Index) const");
    }
    this_local = (Func *)LocalTypes::operator[](&this->local_types,index - IVar1);
  }
  return (Type)this_local;
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}